

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O2

extent idx2::ChunkAddressToSpatial(idx2_file *Idx2,u64 ChunkAddress)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  extent eVar11;
  v3i vVar12;
  extent local_48;
  extent ChunkExtent;
  ulong uVar6;
  
  uVar9 = ChunkAddress >> 0x3c;
  iVar1 = (Idx2->BricksPerChunk).Arr[uVar9];
  uVar3 = (ulong)iVar1;
  iVar10 = 1;
  iVar7 = 1;
  iVar8 = 1;
  uVar6 = uVar9;
  while( true ) {
    iVar5 = (int)uVar6;
    uVar6 = (ulong)(iVar5 - 1);
    if (iVar5 == 0) break;
    iVar7 = (Idx2->GroupBrick3).field_0.field_0.X * iVar7;
    iVar8 = iVar8 * (Idx2->GroupBrick3).field_0.field_0.Y;
    iVar10 = iVar10 * (Idx2->GroupBrick3).field_0.field_0.Z;
  }
  lVar2 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  bVar4 = -(iVar1 == 0) | (byte)lVar2;
  iVar7 = (Idx2->BrickDims3).field_0.field_0.X * iVar7;
  iVar8 = iVar8 * (Idx2->BrickDims3).field_0.field_0.Y;
  iVar10 = iVar10 * (Idx2->BrickDims3).field_0.field_0.Z;
  vVar12 = GetSpatialBrick(Idx2,(uint)(ChunkAddress >> 0x3c),
                           (ChunkAddress >> 0x12 & 0x3ffffffffff) <<
                           ((1L << (bVar4 & 0x3f) != uVar3) + bVar4 & 0x3f));
  ChunkExtent.From =
       (ulong)(vVar12.field_0._8_4_ * iVar10 & 0x1fffff) << 0x2a |
       (ulong)(vVar12.field_0._4_4_ * iVar8 & 0x1fffff) << 0x15 |
       (ulong)(vVar12.field_0._0_4_ * iVar7 & 0x1fffff);
  ChunkExtent.Dims =
       (ulong)(iVar10 * (Idx2->BricksPerChunk3s).Arr[uVar9].field_0.field_0.Z & 0x1fffff) << 0x2a |
       (ulong)(iVar8 * (Idx2->BricksPerChunk3s).Arr[uVar9].field_0.field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(iVar7 * (Idx2->BricksPerChunk3s).Arr[uVar9].field_0.field_0.X & 0x1fffff);
  local_48.From = 0;
  local_48.Dims =
       (ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Idx2->Dims3).field_0.field_0.X & 0x1fffff;
  eVar11 = Crop<idx2::extent,idx2::extent>(&ChunkExtent,&local_48);
  return eVar11;
}

Assistant:

extent
ChunkAddressToSpatial(const idx2_file& Idx2, u64 ChunkAddress)
{
  u64 Brick;
  i8 Level;
  i8 Subband;
  i16 BitPlane;
  UnpackChunkAddress(Idx2, ChunkAddress, &Brick, &Level, &Subband, &BitPlane);
  v3i GroupBrick3 = Pow(Idx2.GroupBrick3, Level);
  v3i BrickDims3 = Idx2.BrickDims3 * GroupBrick3;
  v3i Brick3 = GetSpatialBrick(Idx2, Level, Brick);
  v3i ChunkFrom3 = Brick3 * BrickDims3;
  v3i ChunkDims3 = BrickDims3 * Idx2.BricksPerChunk3s[Level];
  extent ChunkExtent = extent(ChunkFrom3, ChunkDims3);
  return extent(Crop(ChunkExtent, extent(Idx2.Dims3)));
}